

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  path *this;
  bool bVar1;
  bool bVar2;
  file_type fVar3;
  reference p_00;
  ulong uVar4;
  ulong uVar5;
  error_code eVar6;
  bool local_2b9;
  path local_2a8;
  undefined1 local_288 [8];
  path target;
  path local_260;
  file_status local_240;
  file_status sls;
  path local_218;
  string local_1f8;
  path local_1d8;
  path local_1b8;
  byte local_191;
  path local_190;
  undefined1 local_170 [8];
  path pe;
  iterator __end3;
  iterator __begin3;
  path *__range3;
  undefined4 uStack_bc;
  bool redo;
  int local_ac;
  file_status local_a8;
  file_status fs;
  path result;
  undefined1 local_70 [8];
  path root;
  path work;
  error_code *ec_local;
  path *p_local;
  
  bVar1 = path::empty(p);
  if (bVar1) {
    eVar6 = detail::make_error_code(not_found);
    *(ulong *)ec = CONCAT44(work._path.field_2._12_4_,eVar6._M_value);
    ec->_M_cat = eVar6._M_cat;
    path::path(__return_storage_ptr__);
  }
  else {
    bVar1 = path::is_absolute(p);
    if (bVar1) {
      path::path((path *)((long)&root._path.field_2 + 8),p);
    }
    else {
      absolute((path *)((long)&root._path.field_2 + 8),p,ec);
    }
    path::root_path((path *)local_70,(path *)((long)&root._path.field_2 + 8));
    path::path((path *)&fs);
    status((filesystem *)&local_a8,(path *)((long)&root._path.field_2 + 8),ec);
    bVar1 = std::error_code::operator_cast_to_bool(ec);
    if (bVar1) {
      path::path(__return_storage_ptr__);
    }
    else {
      fVar3 = file_status::type(&local_a8);
      if (fVar3 == not_found) {
        eVar6 = detail::make_error_code(not_found);
        *(ulong *)ec = CONCAT44(uStack_bc,eVar6._M_value);
        ec->_M_cat = eVar6._M_cat;
        path::path(__return_storage_ptr__);
      }
      else {
        do {
          bVar1 = false;
          path::clear((path *)&fs);
          this = (path *)((long)&root._path.field_2 + 8);
          path::begin((iterator *)((long)&__end3._current._path.field_2 + 8),this);
          path::end((iterator *)((long)&pe._path.field_2 + 8),this);
          while (bVar2 = path::iterator::operator!=
                                   ((iterator *)((long)&__end3._current._path.field_2 + 8),
                                    (iterator *)((long)&pe._path.field_2 + 8)), bVar2) {
            p_00 = path::iterator::operator*((iterator *)((long)&__end3._current._path.field_2 + 8))
            ;
            path::path((path *)local_170,p_00);
            bVar2 = path::empty((path *)local_170);
            local_191 = 0;
            local_2b9 = true;
            if (!bVar2) {
              path::path<char[2],ghc::filesystem::path>
                        (&local_190,(char (*) [2])0x226cb1,auto_format);
              local_191 = 1;
              local_2b9 = operator==((path *)local_170,&local_190);
            }
            if ((local_191 & 1) != 0) {
              path::~path(&local_190);
            }
            if (local_2b9 == false) {
              path::path<char[3],ghc::filesystem::path>(&local_1b8,(char (*) [3])"..",auto_format);
              bVar2 = operator==((path *)local_170,&local_1b8);
              path::~path(&local_1b8);
              if (bVar2) {
                path::parent_path(&local_1d8,(path *)&fs);
                path::operator=((path *)&fs,&local_1d8);
                path::~path(&local_1d8);
                local_ac = 5;
              }
              else {
                operator/(&local_218,(path *)&fs,(path *)local_170);
                path::string_abi_cxx11_(&local_1f8,&local_218);
                uVar4 = std::__cxx11::string::length();
                path::string_abi_cxx11_((string *)&sls,(path *)local_70);
                uVar5 = std::__cxx11::string::length();
                std::__cxx11::string::~string((string *)&sls);
                std::__cxx11::string::~string((string *)&local_1f8);
                path::~path(&local_218);
                if (uVar5 < uVar4) {
                  operator/(&local_260,(path *)&fs,(path *)local_170);
                  symlink_status((filesystem *)&local_240,&local_260,ec);
                  path::~path(&local_260);
                  bVar2 = std::error_code::operator_cast_to_bool(ec);
                  if (bVar2) {
                    path::path(__return_storage_ptr__);
                    local_ac = 1;
                  }
                  else {
                    file_status::file_status
                              ((file_status *)((long)&target._path.field_2 + 8),&local_240);
                    bVar2 = is_symlink((file_status *)((long)&target._path.field_2 + 8));
                    file_status::~file_status((file_status *)((long)&target._path.field_2 + 8));
                    if (bVar2) {
                      bVar1 = true;
                      operator/(&local_2a8,(path *)&fs,(path *)local_170);
                      read_symlink((path *)local_288,&local_2a8,ec);
                      path::~path(&local_2a8);
                      bVar2 = std::error_code::operator_cast_to_bool(ec);
                      if (bVar2) {
                        path::path(__return_storage_ptr__);
                        local_ac = 1;
                      }
                      else {
                        bVar2 = path::is_absolute((path *)local_288);
                        if (bVar2) {
                          path::operator=((path *)&fs,(path *)local_288);
                          local_ac = 5;
                        }
                        else {
                          path::operator/=((path *)&fs,(path *)local_288);
                          local_ac = 5;
                        }
                      }
                      path::~path((path *)local_288);
                    }
                    else {
                      path::operator/=((path *)&fs,(path *)local_170);
                      local_ac = 0;
                    }
                  }
                  file_status::~file_status(&local_240);
                  if (local_ac == 0) {
                    local_ac = 0;
                  }
                }
                else {
                  path::operator/=((path *)&fs,(path *)local_170);
                  local_ac = 5;
                }
              }
            }
            else {
              local_ac = 5;
            }
            path::~path((path *)local_170);
            if ((local_ac != 0) && (local_ac != 5)) goto LAB_001a767c;
            path::iterator::operator++((iterator *)((long)&__end3._current._path.field_2 + 8));
          }
          local_ac = 4;
LAB_001a767c:
          path::iterator::~iterator((iterator *)((long)&pe._path.field_2 + 8));
          path::iterator::~iterator((iterator *)((long)&__end3._current._path.field_2 + 8));
          if (local_ac != 4) goto LAB_001a7702;
          path::operator=((path *)((long)&root._path.field_2 + 8),(path *)&fs);
        } while (bVar1);
        std::error_code::clear(ec);
        path::path(__return_storage_ptr__,(path *)&fs);
      }
    }
LAB_001a7702:
    file_status::~file_status(&local_a8);
    path::~path((path *)&fs);
    path::~path((path *)local_70);
    path::~path((path *)((long)&root._path.field_2 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path root = work.root_path();
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= root.string().length()) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}